

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_config.cc
# Opt level: O0

bool CheckPeerVerifyPrefs(SSL *ssl)

{
  value_type vVar1;
  ushort uVar2;
  FILE *pFVar3;
  bool bVar4;
  size_t sVar5;
  size_type sVar6;
  const_reference pvVar7;
  size_type local_38;
  size_t i;
  size_t num_peer_sigalgs;
  uint16_t *peer_sigalgs;
  TestConfig *config;
  SSL *ssl_local;
  
  config = (TestConfig *)ssl;
  peer_sigalgs = (uint16_t *)GetTestConfig(ssl);
  bVar4 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::empty
                    (&((TestConfig *)peer_sigalgs)->expect_peer_verify_prefs);
  if (!bVar4) {
    sVar5 = SSL_get0_peer_verify_algorithms((SSL *)config,(uint16_t **)&num_peer_sigalgs);
    sVar6 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size
                      ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                       (peer_sigalgs + 0x38));
    pFVar3 = _stderr;
    if (sVar6 != sVar5) {
      sVar6 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size
                        ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                         (peer_sigalgs + 0x38));
      fprintf(pFVar3,"peer verify preferences length mismatch (got %zu, wanted %zu)\n",sVar5,sVar6);
      return false;
    }
    for (local_38 = 0; local_38 < sVar5; local_38 = local_38 + 1) {
      vVar1 = *(value_type *)(num_peer_sigalgs + local_38 * 2);
      pvVar7 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                         ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                          (peer_sigalgs + 0x38),local_38);
      pFVar3 = _stderr;
      if (vVar1 != *pvVar7) {
        uVar2 = *(ushort *)(num_peer_sigalgs + local_38 * 2);
        pvVar7 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                           ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                            (peer_sigalgs + 0x38),local_38);
        fprintf(pFVar3,"peer verify preference %zu mismatch (got %04x, wanted %04x\n",local_38,
                (ulong)uVar2,(ulong)*pvVar7);
        return false;
      }
    }
  }
  return true;
}

Assistant:

static bool CheckPeerVerifyPrefs(SSL *ssl) {
  const TestConfig *config = GetTestConfig(ssl);
  if (!config->expect_peer_verify_prefs.empty()) {
    const uint16_t *peer_sigalgs;
    size_t num_peer_sigalgs =
        SSL_get0_peer_verify_algorithms(ssl, &peer_sigalgs);
    if (config->expect_peer_verify_prefs.size() != num_peer_sigalgs) {
      fprintf(stderr,
              "peer verify preferences length mismatch (got %zu, wanted %zu)\n",
              num_peer_sigalgs, config->expect_peer_verify_prefs.size());
      return false;
    }
    for (size_t i = 0; i < num_peer_sigalgs; i++) {
      if (peer_sigalgs[i] != config->expect_peer_verify_prefs[i]) {
        fprintf(stderr,
                "peer verify preference %zu mismatch (got %04x, wanted %04x\n",
                i, peer_sigalgs[i], config->expect_peer_verify_prefs[i]);
        return false;
      }
    }
  }
  return true;
}